

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::FiberStack::initialize(FiberStack *this,SynchronousFunc *func)

{
  bool bVar1;
  SynchronousFunc *local_80;
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> local_78 [2];
  Fault local_58;
  Fault f;
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *local_48;
  undefined1 local_40 [8];
  DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
  _kjCondition;
  SynchronousFunc *func_local;
  FiberStack *this_local;
  
  _kjCondition._32_8_ = func;
  local_48 = (OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*> *)
             DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->main);
  f.exception = (Exception *)0x0;
  DebugExpression<kj::OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>&>::operator==
            ((DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
              *)local_40,
             (DebugExpression<kj::OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>&> *)
             &local_48,&f.exception);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>&,decltype(nullptr)>&>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x63c,FAILED,"this->main == nullptr","_kjCondition,",
               (DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
                *)local_40);
    Debug::Fault::fatal(&local_58);
  }
  local_80 = (SynchronousFunc *)_kjCondition._32_8_;
  OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>::
  OneOf<kj::_::FiberStack::SynchronousFunc*,int>
            ((OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*> *)local_78,&local_80);
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::operator=(&this->main,local_78);
  OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>::~OneOf(local_78);
  return;
}

Assistant:

void FiberStack::initialize(SynchronousFunc& func) {
  KJ_REQUIRE(this->main == nullptr);
  this->main = &func;
}